

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  short sVar1;
  int iVar2;
  ThreadSafeArena *this_00;
  Arena *pAVar3;
  btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
  *this_01;
  int iVar4;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_02;
  string *extraout_RAX;
  AllocatedData *pAVar5;
  string *psVar6;
  string *extraout_RAX_00;
  Extension *pEVar7;
  MessageLite *this_03;
  string *psVar8;
  string *extraout_RAX_01;
  long lVar9;
  undefined1 *puVar10;
  uint extraout_EDX;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  long lVar11;
  ThreadSafeArena *pTVar12;
  ExtensionSet *pEVar13;
  ExtensionSet *pEVar14;
  ExtensionSet *this_04;
  ExtensionSet *pEVar15;
  AllocatedData AVar16;
  ulong uVar17;
  Extension *unaff_R14;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar18;
  int iStack_c4;
  code *pcStack_c0;
  ExtensionSet EStack_b8;
  ulong uStack_a0;
  AllocatedData AStack_98;
  AllocatedData *pAStack_90;
  ExtensionSet *pEStack_88;
  ExtensionSet EStack_80;
  ulong uStack_68;
  FieldDescriptor *pFStack_60;
  Extension *pEStack_58;
  ThreadSafeArena *pTStack_50;
  
  if (message == (MessageLite *)0x0) {
    pTStack_50 = (ThreadSafeArena *)0x25cca8;
    pEVar7 = FindOrNull(this,number);
    if (pEVar7 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar7);
    return;
  }
  uVar17 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  this_00 = &this->arena_->impl_;
  pTVar12 = (ThreadSafeArena *)(message->_internal_metadata_).ptr_;
  if (((ulong)pTVar12 & 1) != 0) {
    pTVar12 = *(ThreadSafeArena **)((ulong)pTVar12 & 0xfffffffffffffffe);
  }
  puVar10._1_7_ = (undefined7)((ulong)descriptor >> 8);
  puVar10._0_1_ = pTVar12 != this_00 && pTVar12 != (ThreadSafeArena *)0x0;
  AVar16 = (AllocatedData)message;
  if (puVar10._0_1_) {
    pTStack_50 = (ThreadSafeArena *)0x25cda2;
    SetAllocatedMessage((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_0025cda2:
    pTStack_50 = (ThreadSafeArena *)0x25cdac;
    SetAllocatedMessage((ExtensionSet *)&stack0xffffffffffffffc0);
LAB_0025cdac:
    pTStack_50 = (ThreadSafeArena *)0x25cdbf;
    psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
LAB_0025ccd4:
    if (psVar6 != (string *)0x0) {
      pTStack_50 = (ThreadSafeArena *)0x25ce07;
      SetAllocatedMessage();
      goto LAB_0025ce07;
    }
    puVar10._0_4_ = unaff_R14->type - 0x13;
    puVar10._4_4_ = 0;
    if ((byte)(uint)puVar10 < 0xee) {
      pEVar13 = (ExtensionSet *)&stack0xffffffffffffffc0;
      pTStack_50 = (ThreadSafeArena *)0x25cdce;
      SetAllocatedMessage(pEVar13);
LAB_0025cdce:
      pTStack_50 = (ThreadSafeArena *)0x25cddf;
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pEVar13,10,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
      goto LAB_0025cc84;
    }
    puVar10 = WireFormatLite::kFieldTypeToCppTypeMap;
    if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)unaff_R14->type * 4) == 10)
    {
      psVar6 = (string *)0x0;
    }
    else {
      pTStack_50 = (ThreadSafeArena *)0x25cdf5;
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                          (ulong)unaff_R14->type * 4),10,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    }
    if (psVar6 == (string *)0x0) {
      if ((unaff_R14->field_0xa & 4) != 0) {
        pTStack_50 = (ThreadSafeArena *)0x25cd60;
        (**(code **)(**(long **)&(unaff_R14->field_0).int32_t_value + 0x30))
                  (*(long **)&(unaff_R14->field_0).int32_t_value,message,this_00);
        goto LAB_0025cd77;
      }
      if ((this_00 == (ThreadSafeArena *)0x0) &&
         ((long *)(unaff_R14->field_0).int64_t_value != (long *)0x0)) {
        pTStack_50 = (ThreadSafeArena *)0x25cd27;
        (**(code **)(*(long *)(unaff_R14->field_0).int64_t_value + 8))();
      }
      goto LAB_0025cd27;
    }
  }
  else {
    pTStack_50 = (ThreadSafeArena *)0x25cc4d;
    pVar18 = Insert(this,number);
    unaff_R14 = pVar18.first;
    unaff_R14->descriptor = descriptor;
    if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (unaff_R14->is_repeated != false) goto LAB_0025cdac;
      psVar6 = (string *)0x0;
      goto LAB_0025ccd4;
    }
    unaff_R14->type = (FieldType)uVar17;
    if ((byte)(type - 0x13) < 0xee) goto LAB_0025cda2;
    puVar10 = WireFormatLite::kFieldTypeToCppTypeMap;
    pEVar13 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (pEVar13 != (ExtensionSet *)0xa) goto LAB_0025cdce;
    psVar6 = (string *)0x0;
LAB_0025cc84:
    if (psVar6 == (string *)0x0) {
      unaff_R14->is_repeated = false;
      unaff_R14->field_0xa = (unaff_R14->field_0xa & 0xfa) + 1;
LAB_0025cd27:
      if (pTVar12 == this_00) {
        unaff_R14->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
      }
      else if (pTVar12 == (ThreadSafeArena *)0x0) {
        unaff_R14->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
        pTStack_50 = (ThreadSafeArena *)0x25cd77;
        ThreadSafeArena::AddCleanup
                  (this_00,message,arena_delete_object<google::protobuf::MessageLite>);
      }
      else {
        pTStack_50 = (ThreadSafeArena *)0x25cd3c;
        this_02 = (anon_union_8_9_fdc4a54a_for_Extension_0)
                  MessageLite::New(message,(Arena *)this_00);
        unaff_R14->field_0 = this_02;
        pTStack_50 = (ThreadSafeArena *)0x25cd4a;
        MessageLite::CheckTypeAndMergeFrom((MessageLite *)this_02,message);
      }
LAB_0025cd77:
      unaff_R14->field_0xa = unaff_R14->field_0xa & 0xfd;
      return;
    }
LAB_0025ce07:
    pTStack_50 = (ThreadSafeArena *)0x25ce14;
    SetAllocatedMessage();
    psVar6 = extraout_RAX;
  }
  iVar4 = (int)psVar6;
  pEVar13 = (ExtensionSet *)&stack0xffffffffffffffc0;
  pTStack_50 = (ThreadSafeArena *)0x25ce21;
  SetAllocatedMessage();
  pEVar14 = &EStack_80;
  this_04 = &EStack_80;
  EStack_80.map_ = (AllocatedData)message;
  uStack_68 = uVar17;
  pFStack_60 = descriptor;
  pEStack_58 = unaff_R14;
  pTStack_50 = this_00;
  if (AVar16.flat == (KeyValue *)0x0) {
    pEStack_88 = (ExtensionSet *)0x25cea6;
    pEVar7 = FindOrNull(pEVar13,iVar4);
    if (pEVar7 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar7);
    return;
  }
  pEStack_88 = (ExtensionSet *)0x25ce48;
  pVar18 = Insert(pEVar13,iVar4);
  pAVar5 = (AllocatedData *)pVar18.first;
  pAVar5[2] = (AllocatedData)puVar10;
  if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(bool *)((long)pAVar5 + 9) != false) goto LAB_0025cf54;
    psVar6 = (string *)0x0;
LAB_0025ced1:
    if (psVar6 != (string *)0x0) {
      pEStack_88 = (ExtensionSet *)0x25cfab;
      UnsafeArenaSetAllocatedMessage();
      goto LAB_0025cfab;
    }
    if ((byte)(*(byte *)(pAVar5 + 1) - 0x13) < 0xee) {
      pEStack_88 = (ExtensionSet *)0x25cf74;
      UnsafeArenaSetAllocatedMessage(&EStack_80);
      goto LAB_0025cf74;
    }
    if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)*(byte *)(pAVar5 + 1) * 4)
        == 10) {
      psVar6 = (string *)0x0;
    }
    else {
      pEStack_88 = (ExtensionSet *)0x25cf9b;
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                          (ulong)*(byte *)(pAVar5 + 1) * 4),10,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    }
    if (psVar6 == (string *)0x0) {
      if ((*(byte *)((long)pAVar5 + 10) & 4) != 0) {
        pEStack_88 = (ExtensionSet *)0x25cf39;
        (**(code **)((pAVar5->large->
                     super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     ).
                     super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     .
                     super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     .tree_.root_ + 0x38))(pAVar5->large,AVar16.flat,pEVar13->arena_);
        goto LAB_0025cf39;
      }
      if ((pEVar13->arena_ == (Arena *)0x0) && (pAVar5->large != (LargeMap *)0x0)) {
        pEStack_88 = (ExtensionSet *)0x25cf25;
        (**(code **)((pAVar5->large->
                     super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     ).
                     super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     .
                     super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     .tree_.root_ + 8))();
      }
      goto LAB_0025cf25;
    }
  }
  else {
    *(FieldType *)(pAVar5 + 1) = (FieldType)extraout_EDX;
    if ((byte)((FieldType)extraout_EDX - 0x13) < 0xee) {
      pEStack_88 = (ExtensionSet *)0x25cf54;
      UnsafeArenaSetAllocatedMessage(&EStack_80);
LAB_0025cf54:
      pEStack_88 = (ExtensionSet *)0x25cf67;
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (0,1,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
      goto LAB_0025ced1;
    }
    pEVar14 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                              (ulong)(extraout_EDX & 0xff) * 4);
    if (pEVar14 == (ExtensionSet *)0xa) {
      psVar6 = (string *)0x0;
    }
    else {
LAB_0025cf74:
      pEStack_88 = (ExtensionSet *)0x25cf85;
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pEVar14,10,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
    }
    if (psVar6 == (string *)0x0) {
      *(bool *)((long)pAVar5 + 9) = false;
      *(byte *)((long)pAVar5 + 10) = (*(byte *)((long)pAVar5 + 10) & 0xfa) + 1;
LAB_0025cf25:
      pAVar5->flat = (KeyValue *)AVar16;
LAB_0025cf39:
      *(byte *)((long)pAVar5 + 10) = *(byte *)((long)pAVar5 + 10) & 0xfd;
      return;
    }
LAB_0025cfab:
    pEStack_88 = (ExtensionSet *)0x25cfb6;
    UnsafeArenaSetAllocatedMessage();
    psVar6 = extraout_RAX_00;
  }
  pEStack_88 = (ExtensionSet *)0x25cfc1;
  UnsafeArenaSetAllocatedMessage();
  pEVar14 = &EStack_b8;
  pEVar15 = &EStack_b8;
  pcStack_c0 = (code *)0x25cfdc;
  EStack_b8.map_ = AVar16;
  uStack_a0 = (ulong)extraout_EDX;
  AStack_98 = (AllocatedData)puVar10;
  pAStack_90 = pAVar5;
  pEStack_88 = pEVar13;
  pEVar7 = FindOrNull(this_04,(int)psVar6);
  if (pEVar7 == (Extension *)0x0) {
    return;
  }
  if (pEVar7->is_repeated == false) {
    psVar8 = (string *)0x0;
  }
  else {
    pcStack_c0 = (code *)0x25d0ad;
    psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (psVar8 != (string *)0x0) {
    pcStack_c0 = (code *)0x25d0db;
    ReleaseMessage();
    psVar8 = extraout_RAX_01;
    goto LAB_0025d0db;
  }
  if ((byte)(pEVar7->type - 0x13) < 0xee) {
    pcStack_c0 = (code *)0x25d0ba;
    ReleaseMessage(&EStack_b8);
LAB_0025d0ba:
    pcStack_c0 = (code *)0x25d0cb;
    psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)pEVar14,10,
                        "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
  }
  else {
    pEVar14 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar7->type * 4);
    if (pEVar14 != (ExtensionSet *)0xa) goto LAB_0025d0ba;
    psVar8 = (string *)0x0;
  }
  if (psVar8 == (string *)0x0) {
    pAVar3 = this_04->arena_;
    if ((pEVar7->field_0xa & 4) == 0) {
      if (pAVar3 != (Arena *)0x0) {
        pcStack_c0 = (code *)0x25d045;
        this_03 = MessageLite::New((MessageLite *)pEVar7->field_0,(Arena *)0x0);
        pcStack_c0 = (code *)0x25d053;
        MessageLite::CheckTypeAndMergeFrom(this_03,(MessageLite *)pEVar7->field_0);
      }
    }
    else {
      pcStack_c0 = (code *)0x25d069;
      (**(code **)(**(long **)&(pEVar7->field_0).int32_t_value + 0x40))
                (*(long **)&(pEVar7->field_0).int32_t_value,extraout_RDX,pAVar3);
      if ((pAVar3 == (Arena *)0x0) && ((long *)(pEVar7->field_0).int64_t_value != (long *)0x0)) {
        pcStack_c0 = (code *)0x25d07f;
        (**(code **)(*(long *)(pEVar7->field_0).int64_t_value + 8))();
      }
    }
    pcStack_c0 = (code *)0x25d089;
    Erase(this_04,(int)psVar6);
    return;
  }
LAB_0025d0db:
  iVar4 = (int)psVar8;
  pcStack_c0 = Erase;
  ReleaseMessage();
  sVar1 = *(short *)((long)pEVar15 + 10);
  this_01 = *(btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
              **)((long)pEVar15 + 0x10);
  iStack_c4 = iVar4;
  pcStack_c0 = (code *)((ulong)psVar6 & 0xffffffff);
  if ((long)sVar1 < 0) {
    absl::lts_20240722::container_internal::
    btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
    ::erase<int>(this_01,&iStack_c4);
  }
  else if (sVar1 != 0) {
    lVar11 = (long)sVar1 * 0x20;
    lVar9 = 0;
    do {
      iVar2 = *(int *)((long)&(this_01->tree_).root_ + lVar9);
      if (iVar2 != iVar4 && iVar4 <= iVar2) {
        return;
      }
      if (iVar2 == iVar4) {
        if (lVar11 + -0x20 != lVar9) {
          memmove((void *)((long)&(this_01->tree_).root_ + lVar9),
                  (void *)((long)&this_01[1].tree_.rightmost_.
                                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                                  .
                                  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*,_2UL,_false>
                                  .value + lVar9),(lVar11 - lVar9) - 0x20);
        }
        *(short *)((long)pEVar15 + 10) = *(short *)((long)pEVar15 + 10) + -1;
        return;
      }
      lVar9 = lVar9 + 0x20;
    } while (lVar11 != lVar9);
  }
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Arena* const arena = arena_;
  Arena* const message_arena = message->GetArena();
  ABSL_DCHECK(message_arena == nullptr || message_arena == arena);

  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    if (message_arena == arena) {
      extension->ptr.message_value = message;
    } else if (message_arena == nullptr) {
      extension->ptr.message_value = message;
      arena->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->ptr.message_value = message->New(arena);
      extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->SetAllocatedMessage(message, arena);
    } else {
      if (arena == nullptr) {
        delete extension->ptr.message_value;
      }
      if (message_arena == arena) {
        extension->ptr.message_value = message;
      } else if (message_arena == nullptr) {
        extension->ptr.message_value = message;
        arena->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->ptr.message_value = message->New(arena);
        extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}